

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_quad_to(plutovg_path_t *path,float x1,float y1,float x2,float y2)

{
  plutovg_point_t pVar1;
  float fVar2;
  float fVar3;
  
  if (path->num_points < 1) {
    fVar2 = 0.0;
    fVar3 = 0.0;
  }
  else {
    pVar1 = (path->elements).data[(long)(path->elements).size + -1].point;
    fVar2 = pVar1.x * 0.33333334;
    fVar3 = pVar1.y * 0.33333334;
  }
  plutovg_path_cubic_to
            (path,x1 * 0.6666667 + fVar2,fVar3 + y1 * 0.6666667,x2 * 0.33333334 + x1 * 0.6666667,
             y2 * 0.33333334 + y1 * 0.6666667,x2,y2);
  return;
}

Assistant:

void plutovg_path_quad_to(plutovg_path_t* path, float x1, float y1, float x2, float y2)
{
    float current_x, current_y;
    plutovg_path_get_current_point(path, &current_x, &current_y);
    float cp1x = 2.f / 3.f * x1 + 1.f / 3.f * current_x;
    float cp1y = 2.f / 3.f * y1 + 1.f / 3.f * current_y;
    float cp2x = 2.f / 3.f * x1 + 1.f / 3.f * x2;
    float cp2y = 2.f / 3.f * y1 + 1.f / 3.f * y2;
    plutovg_path_cubic_to(path, cp1x, cp1y, cp2x, cp2y, x2, y2);
}